

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O0

void reset_part_limitations(AV1_COMP *cpi,PartitionSearchState *part_search_state)

{
  bool bVar1;
  _Bool _Var2;
  BLOCK_SIZE BVar3;
  long in_RSI;
  long in_RDI;
  int is_rect_part_allowed;
  PartitionBlkParams blk_params;
  bool local_45;
  bool local_44;
  bool local_43;
  bool local_42;
  undefined1 local_3c;
  PARTITION_TYPE in_stack_ffffffffffffffc5;
  BLOCK_SIZE in_stack_ffffffffffffffc6;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  
  memcpy(&local_3c,(void *)(in_RSI + 8),0x2c);
  bVar1 = false;
  if ((local_20 != 0) && (bVar1 = false, (*(byte *)(in_RDI + 0x426fe) & 1) != 0)) {
    bVar1 = local_24 < local_28;
  }
  local_42 = local_20 != 0 && local_24 < local_28;
  *(uint *)(in_RSI + 300) = (uint)local_42;
  _Var2 = av1_blk_has_rows_and_cols((PartitionBlkParams *)&local_3c);
  local_43 = _Var2 && local_24 <= local_28;
  *(uint *)(in_RSI + 0x11c) = (uint)local_43;
  local_44 = false;
  if ((local_18 != 0) && (local_44 = false, bVar1)) {
    BVar3 = get_partition_subsize(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc5);
    BVar3 = get_plane_block_size(BVar3,*(int *)(in_RSI + 0x138),*(int *)(in_RSI + 0x13c));
    local_44 = BVar3 != BLOCK_INVALID;
  }
  *(uint *)(in_RSI + 0x120) = (uint)local_44;
  local_45 = false;
  if ((local_1c != 0) && (local_45 = false, bVar1)) {
    BVar3 = get_partition_subsize(in_stack_ffffffffffffffc6,in_stack_ffffffffffffffc5);
    BVar3 = get_plane_block_size(BVar3,*(int *)(in_RSI + 0x138),*(int *)(in_RSI + 0x13c));
    local_45 = BVar3 != BLOCK_INVALID;
  }
  *(uint *)(in_RSI + 0x124) = (uint)local_45;
  *(undefined4 *)(in_RSI + 0x118) = 0;
  return;
}

Assistant:

static inline void reset_part_limitations(
    AV1_COMP *const cpi, PartitionSearchState *part_search_state) {
  PartitionBlkParams blk_params = part_search_state->part_blk_params;
  const int is_rect_part_allowed =
      blk_params.bsize_at_least_8x8 &&
      cpi->oxcf.part_cfg.enable_rect_partitions &&
      (blk_params.width > blk_params.min_partition_size_1d);
  part_search_state->do_square_split =
      blk_params.bsize_at_least_8x8 &&
      (blk_params.width > blk_params.min_partition_size_1d);
  part_search_state->partition_none_allowed =
      av1_blk_has_rows_and_cols(&blk_params) &&
      (blk_params.width >= blk_params.min_partition_size_1d);
  part_search_state->partition_rect_allowed[HORZ] =
      blk_params.has_cols && is_rect_part_allowed &&
      get_plane_block_size(
          get_partition_subsize(blk_params.bsize, PARTITION_HORZ),
          part_search_state->ss_x, part_search_state->ss_y) != BLOCK_INVALID;
  part_search_state->partition_rect_allowed[VERT] =
      blk_params.has_rows && is_rect_part_allowed &&
      get_plane_block_size(
          get_partition_subsize(blk_params.bsize, PARTITION_VERT),
          part_search_state->ss_x, part_search_state->ss_y) != BLOCK_INVALID;
  part_search_state->terminate_partition_search = 0;
}